

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.c
# Opt level: O3

Symbol * elf_bssentry(GlobalVars *gv,char *secname,Symbol *xdef,bool relaflag,size_t relocsize,
                     size_t addrsize)

{
  Symbol *pSVar1;
  Reloc *r;
  ObjectUnit *ou;
  
  ou = gv->dynobj;
  if (ou == (ObjectUnit *)0x0) {
    ierror("elf_bssentry(): no dynobj");
    ou = gv->dynobj;
  }
  pSVar1 = bss_entry(ou,secname,xdef);
  if (pSVar1 != (Symbol *)0x0) {
    r = newreloc(gv,pSVar1->relsect,pSVar1->name,(Section *)0x0,0,0,'\x0e',0);
    (r->relocsect).symbol = pSVar1;
    addreloc(pSVar1->relsect,r,0,(uint16_t)addrsize,-1);
    elf_dynreloc(pSVar1->relsect->obj,r,relaflag,relocsize);
    xdef = pSVar1;
  }
  return xdef;
}

Assistant:

struct Symbol *elf_bssentry(struct GlobalVars *gv,const char *secname,
                            struct Symbol *xdef,bool relaflag,
                            size_t relocsize,size_t addrsize)
/* Allocate space for a copy-object in a .bss or .sbss section and create
   a R_COPY relocation to the original symbol in the shared object. */
{
  struct Symbol *newxdef;

  if (gv->dynobj == NULL)
    ierror("elf_bssentry(): no dynobj");
  newxdef = bss_entry(gv->dynobj,secname,xdef);

  if (newxdef) {
    /* entry in BSS was done, so we need a R_COPY relocation */
    struct Reloc *r;

    xdef = newxdef;
    r = newreloc(gv,xdef->relsect,xdef->name,NULL,0,0,R_COPY,0);
    r->relocsect.symbol = xdef;
    addreloc(xdef->relsect,r,0,addrsize,-1);  /* mask/size irrel. for R_COPY */
    elf_dynreloc(xdef->relsect->obj,r,relaflag,relocsize);
  }

  return xdef;
}